

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

double av1_estimate_noise_from_single_plane_c
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  int iVar1;
  int iVar2;
  double local_80;
  int v;
  int Ga;
  int Gy;
  int Gx;
  int idx;
  int jj;
  int ii;
  int mat [3] [3];
  int local_2c;
  int center_idx;
  int j;
  int i;
  int count;
  int64_t accum;
  int edge_thresh_local;
  int stride_local;
  int width_local;
  int height_local;
  
  _i = 0;
  j = 0;
  for (center_idx = 1; center_idx < height + -1; center_idx = center_idx + 1) {
    for (local_2c = 1; local_2c < width + -1; local_2c = local_2c + 1) {
      mat[2][2] = center_idx * stride + local_2c;
      for (idx = -1; idx < 2; idx = idx + 1) {
        for (Gx = -1; Gx < 2; Gx = Gx + 1) {
          (&jj)[(long)(idx + 1) * 3 + (long)(Gx + 1)] = (uint)src[mat[2][2] + idx * stride + Gx];
        }
      }
      iVar1 = (jj - mat[0][0]) + (mat[1][1] - mat[2][0]) + (mat[0][1] - mat[1][0]) * 2;
      iVar2 = (jj - mat[1][1]) + (mat[0][0] - mat[2][0]) + (ii - mat[1][2]) * 2;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar1 + iVar2 < edge_thresh) {
        iVar1 = mat[0][2] * 4 + (ii + mat[1][2] + mat[0][1] + mat[1][0]) * -2 +
                jj + mat[0][0] + mat[1][1] + mat[2][0];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        _i = iVar1 + _i;
        j = j + 1;
      }
    }
  }
  if (j < 0x10) {
    local_80 = -1.0;
  }
  else {
    local_80 = ((double)_i / (double)(j * 6)) * 1.25331413732;
  }
  return local_80;
}

Assistant:

double av1_estimate_noise_from_single_plane_c(const uint8_t *src, int height,
                                              int width, int stride,
                                              int edge_thresh) {
  int64_t accum = 0;
  int count = 0;

  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), 0);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), 0);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}